

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O2

void nn_random_generate(void *buf,size_t len)

{
  size_t __n;
  uint64_t uVar1;
  
  uVar1 = nn_random_state;
  while( true ) {
    uVar1 = uVar1 * 0x41c64e6d + 0x3039;
    __n = 8;
    if (len < 8) {
      __n = len;
    }
    nn_random_state = uVar1;
    memcpy(buf,&nn_random_state,__n);
    if (len < 9) break;
    len = len - 8;
    buf = (void *)((long)buf + 8);
  }
  return;
}

Assistant:

void nn_random_generate (void *buf, size_t len)
{
    uint8_t *pos;

    pos = (uint8_t*) buf;

    while (1) {

        /*  Generate a pseudo-random integer. */
        nn_random_state = nn_random_state * 1103515245 + 12345;

        /*  Move the bytes to the output buffer. */
        memcpy (pos, &nn_random_state, len > 8 ? 8 : len);
        if (nn_fast (len <= 8))
            return;
        len -= 8;
        pos += 8;
    }
}